

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_gtest_tests::iu_GTestSyntaxTest_x_iutest_x_Skip_Test::Body
          (iu_GTestSyntaxTest_x_iutest_x_Skip_Test *this)

{
  bool bVar1;
  Fixed *fixed;
  char *message;
  AssertionHelper local_1e0;
  Fixed local_1a0;
  int local_14;
  iu_GTestSyntaxTest_x_iutest_x_Skip_Test *piStack_10;
  int x;
  iu_GTestSyntaxTest_x_iutest_x_Skip_Test *this_local;
  
  local_14 = 1;
  piStack_10 = this;
  iutest::detail::AlwaysZero();
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    memset(&local_1a0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1a0);
    fixed = iutest::AssertionHelper::Fixed::operator<<(&local_1a0,local_14);
    bVar1 = iutest::UnitTestImpl::SkipTest();
    message = "Skipped. but already failed. ";
    if (bVar1) {
      message = "Skipped. ";
    }
    iutest::AssertionHelper::AssertionHelper
              (&local_1e0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0x1bf,message,kSkip);
    iutest::AssertionHelper::operator=(&local_1e0,fixed);
    iutest::AssertionHelper::~AssertionHelper(&local_1e0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1a0);
  }
  return;
}

Assistant:

TEST(GTestSyntaxTest, Skip)
{
    if( int x = 1 )
        GTEST_SKIP() << x;
}